

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O0

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
jsoncons::jsonpointer::
get<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *root,
          basic_json_pointer<char> *location,bool create_if_missing,error_code *ec)

{
  bool bVar1;
  reference this;
  error_code *in_RCX;
  byte in_DL;
  basic_json_pointer<char> *in_RDI;
  iterator end;
  iterator it;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *current;
  basic_json_pointer<char> *in_stack_ffffffffffffffa8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  basic_json_pointer<char> *local_30;
  error_code *local_28;
  byte local_19;
  basic_json_pointer<char> *local_10;
  basic_json_pointer<char> *local_8;
  
  local_19 = in_DL & 1;
  local_28 = in_RCX;
  local_10 = in_RDI;
  bVar1 = basic_json_pointer<char>::empty((basic_json_pointer<char> *)0x555835);
  if (bVar1) {
    local_8 = local_10;
  }
  else {
    local_30 = local_10;
    local_38._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         basic_json_pointer<char>::begin_abi_cxx11_(in_stack_ffffffffffffffa8);
    basic_json_pointer<char>::end_abi_cxx11_(in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffffb0,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffffa8), bVar1) {
      in_stack_ffffffffffffffa8 = local_30;
      this = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_38);
      in_stack_ffffffffffffffb0 =
           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
      local_30 = (basic_json_pointer<char> *)
                 detail::
                 resolve<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           (root,(string_view_type *)location,create_if_missing,ec);
      bVar1 = std::error_code::operator_cast_to_bool(local_28);
      if (bVar1) {
        return (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               local_30;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_38);
    }
    local_8 = local_30;
  }
  return (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)local_8;
}

Assistant:

Json& get(Json& root, 
              const basic_json_pointer<typename Json::char_type>& location, 
              bool create_if_missing,
              std::error_code& ec)
    {
        if (location.empty())
        {
            return root;
        }

        Json* current = std::addressof(root);
        auto it = location.begin();
        auto end = location.end();
        while (it != end)
        {
            current = jsoncons::jsonpointer::detail::resolve(current, *it, create_if_missing, ec);
            if (JSONCONS_UNLIKELY(ec))
                return *current;
            ++it;
        }
        return *current;
    }